

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

ssize_t __thiscall
kj::anon_unknown_123::AsyncPipe::write(AsyncPipe *this,int __fd,void *__buf,size_t __n)

{
  AsyncCapabilityStream *pAVar1;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> morePieces;
  void *pvVar2;
  undefined4 in_register_00000034;
  OneOf<kj::ArrayPtr<const_int>,_kj::Array<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>
  local_50;
  
  while( true ) {
    if (__n == 0) {
      kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
      return (ssize_t)this;
    }
    if (((ArrayPtr<const_unsigned_char> *)__buf)->size_ != 0) break;
    __buf = (void *)((long)__buf + 0x10);
    __n = __n - 1;
  }
  pAVar1 = (((AsyncPipe *)CONCAT44(in_register_00000034,__fd))->state).ptr;
  if (pAVar1 != (AsyncCapabilityStream *)0x0) {
    (*(pAVar1->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream[1])
              (this,&(pAVar1->super_AsyncIoStream).super_AsyncOutputStream,__buf);
    return (ssize_t)this;
  }
  pvVar2 = operator_new(0x400);
  *(undefined8 *)((long)pvVar2 + 0x1d8) = 0;
  *(undefined8 *)((long)pvVar2 + 0x1e0) = 0;
  *(undefined ***)((long)pvVar2 + 0x1d0) = &PTR_destroy_005994c0;
  *(undefined ***)((long)pvVar2 + 0x1e8) = &PTR_reject_00599510;
  *(undefined1 *)((long)pvVar2 + 0x1f0) = 0;
  *(undefined1 *)((long)pvVar2 + 0x388) = 0;
  *(undefined1 *)((long)pvVar2 + 0x390) = 1;
  local_50._0_8_ = (ulong)(uint)local_50._4_4_ << 0x20;
  morePieces.size_ = __n - 1;
  morePieces.ptr = (ArrayPtr<const_unsigned_char> *)((long)__buf + 0x10);
  BlockedWrite::BlockedWrite
            ((BlockedWrite *)((long)pvVar2 + 0x398),(PromiseFulfiller<void> *)((long)pvVar2 + 0x1e8)
             ,(AsyncPipe *)CONCAT44(in_register_00000034,__fd),*__buf,morePieces,&local_50);
  OneOf<kj::ArrayPtr<const_int>,_kj::Array<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>::
  ~OneOf(&local_50);
  *(void **)((long)pvVar2 + 0x1d8) = pvVar2;
  local_50.tag = 0;
  local_50._4_4_ = 0;
  Own<kj::_::AdapterPromiseNode<kj::_::Void,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite>,_kj::_::PromiseDisposer>
  ::~Own((Own<kj::_::AdapterPromiseNode<kj::_::Void,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite>,_kj::_::PromiseDisposer>
          *)&local_50);
  (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
  _vptr_AsyncInputStream = (_func_int **)((long)pvVar2 + 0x1d0);
  local_50.tag = 0;
  local_50._4_4_ = 0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_50);
  return (ssize_t)this;
}

Assistant:

Promise<void> write(ArrayPtr<const ArrayPtr<const byte>> pieces) override {
    while (pieces.size() > 0 && pieces[0].size() == 0) {
      pieces = pieces.slice(1, pieces.size());
    }

    if (pieces.size() == 0) {
      return kj::READY_NOW;
    } else KJ_IF_SOME(s, state) {
      return s.write(pieces);
    } else {
      return newAdaptedPromise<void, BlockedWrite>(
          *this, pieces[0], pieces.slice(1, pieces.size()));
    }
  }